

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

void handle_event(snd_seq_event_t *ev)

{
  undefined8 uVar1;
  uchar *puVar2;
  snd_seq_tick_time_t timestamp_00;
  code *pcVar3;
  PmEvent PVar4;
  int iVar5;
  long lVar6;
  size_t __n;
  uchar *puVar7;
  undefined8 uStack_70;
  uchar auStack_68 [8];
  ulong local_60;
  int local_54;
  uchar *local_50;
  uchar *local_48;
  uchar *ptr;
  snd_seq_queue_status_t *queue_status;
  code *pcStack_30;
  PmTimestamp timestamp;
  PmTimeProcPtr time_proc;
  PmEvent pm_ev;
  PmInternal *midi;
  int device_id;
  snd_seq_event_t *ev_local;
  
  puVar7 = auStack_68;
  pm_ev = (PmEvent)descriptors[(int)(uint)(ev->dest).port].internalDescriptor;
  if (pm_ev != (PmEvent)0x0) {
    pcStack_30 = *(code **)((long)pm_ev + 8);
    if ((ev->flags & 1) != 0) {
      uStack_70 = 0x1069dd;
      __assert_fail("(ev->flags & SND_SEQ_TIME_STAMP_MASK) == SND_SEQ_TIME_STAMP_TICK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_linux/pmlinuxalsa.c"
                    ,0x1f2,"void handle_event(snd_seq_event_t *)");
    }
    if (pcStack_30 == (code *)0x0) {
      queue_status._4_4_ = (ev->time).tick;
    }
    else {
      uStack_70 = 0x1069f7;
      lVar6 = snd_seq_queue_status_sizeof();
      lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
      puVar7 = auStack_68 + lVar6;
      local_50 = puVar7;
      ptr = puVar7;
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x106a1c;
      __n = snd_seq_queue_status_sizeof();
      puVar2 = local_50;
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x106a2a;
      memset(puVar2,0,__n);
      puVar2 = ptr;
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x106a40;
      snd_seq_get_queue_status(seq,queue,puVar2);
      pcVar3 = pcStack_30;
      uVar1 = *(undefined8 *)((long)pm_ev + 0x10);
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x106a4e;
      local_54 = (*pcVar3)(uVar1);
      puVar2 = ptr;
      local_54 = local_54 + (ev->time).tick;
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x106a61;
      iVar5 = snd_seq_queue_status_get_tick_time(puVar2);
      queue_status._4_4_ = local_54 - iVar5;
    }
    PVar4 = pm_ev;
    timestamp_00 = queue_status._4_4_;
    time_proc._4_4_ = queue_status._4_4_;
    local_60 = (ulong)(ev->type - 6);
    switch(local_60) {
    case 0:
      time_proc._0_4_ =
           ((ev->data).note.velocity & 0x7f) << 0x10 | ((ev->data).note.note & 0x7f) << 8 |
           (ev->data).note.channel | 0x90;
      puVar7[-8] = 0xed;
      puVar7[-7] = 'j';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 1:
      time_proc._0_4_ =
           ((ev->data).note.velocity & 0x7f) << 0x10 | ((ev->data).note.note & 0x7f) << 8 |
           (ev->data).note.channel | 0x80;
      builtin_memcpy(puVar7 + -8,"Ak\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 2:
      time_proc._0_4_ =
           ((ev->data).note.velocity & 0x7f) << 0x10 | ((ev->data).note.note & 0x7f) << 8 |
           (ev->data).note.channel | 0xa0;
      puVar7[-8] = 0x95;
      puVar7[-7] = 'k';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 4:
      time_proc._0_4_ =
           ((ev->data).raw32.d[2] & 0x7f) << 0x10 | ((ev->data).note.duration & 0x7f) << 8 |
           (ev->data).note.channel | 0xb0;
      puVar7[-8] = 0xe7;
      puVar7[-7] = 'k';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 5:
      time_proc._0_4_ = ((ev->data).raw32.d[2] & 0x7f) << 8 | (ev->data).note.channel | 0xc0;
      builtin_memcpy(puVar7 + -8,"\'l\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 6:
      time_proc._0_4_ = ((ev->data).raw32.d[2] & 0x7f) << 8 | (ev->data).note.channel | 0xd0;
      builtin_memcpy(puVar7 + -8,"gl\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 7:
      time_proc._0_4_ =
           ((ev->data).control.value + 0x2000 >> 7 & 0x7fU) << 0x10 |
           ((ev->data).control.value + 0x2000U & 0x7f) << 8 | (ev->data).note.channel | 0xe0;
      puVar7[-8] = 199;
      puVar7[-7] = 'l';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 8:
      if ((ev->data).note.duration < 0x20) {
        time_proc._0_4_ =
             ((ev->data).control.value >> 7 & 0x7fU) << 0x10 |
             ((ev->data).note.duration & 0xff) << 8 | (ev->data).note.channel | 0xb0;
        builtin_memcpy(puVar7 + -8,"\'m\x10",4);
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
        PVar4 = pm_ev;
        time_proc._0_4_ =
             ((ev->data).raw32.d[2] & 0x7f) << 0x10 | ((ev->data).note.duration + 0x20 & 0xff) << 8
             | (ev->data).note.channel | 0xb0;
        builtin_memcpy(puVar7 + -8,"tm\x10",4);
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      }
      else {
        time_proc._0_4_ =
             ((ev->data).raw32.d[2] & 0x7f) << 0x10 | ((ev->data).note.duration & 0x7f) << 8 |
             (ev->data).note.channel | 0xb0;
        puVar7[-8] = 0xc3;
        puVar7[-7] = 'm';
        puVar7[-6] = '\x10';
        puVar7[-5] = '\0';
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      }
      break;
    case 0xe:
      time_proc._0_4_ =
           ((ev->data).control.value >> 7 & 0x7fU) << 0x10 | ((ev->data).raw32.d[2] & 0x7f) << 8 |
           0xf2;
      builtin_memcpy(puVar7 + -8,"\an\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0xf:
      time_proc._0_4_ = ((ev->data).raw32.d[2] & 0x7f) << 8 | 0xf3;
      builtin_memcpy(puVar7 + -8,"6n\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x10:
      time_proc._0_4_ = ((ev->data).raw32.d[2] & 0x7f) << 8 | 0xf1;
      builtin_memcpy(puVar7 + -8,"en\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x18:
      time_proc._0_4_ = 0xfa;
      builtin_memcpy(puVar7 + -8,"~n\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x19:
      time_proc._0_4_ = 0xfb;
      puVar7[-8] = 0x97;
      puVar7[-7] = 'n';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x1a:
      time_proc._0_4_ = 0xfc;
      puVar7[-8] = 0xb0;
      puVar7[-7] = 'n';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x1e:
      time_proc._0_4_ = 0xf8;
      puVar7[-8] = 0xc6;
      puVar7[-7] = 'n';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x22:
      time_proc._0_4_ = 0xf6;
      puVar7[-8] = 0xdc;
      puVar7[-7] = 'n';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x23:
      time_proc._0_4_ = 0xff;
      puVar7[-8] = 0xf2;
      puVar7[-7] = 'n';
      puVar7[-6] = '\x10';
      puVar7[-5] = '\0';
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x24:
      time_proc._0_4_ = 0xfe;
      builtin_memcpy(puVar7 + -8,"\bo\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_short((PmInternal *)PVar4,(PmEvent *)&time_proc);
      break;
    case 0x7c:
      puVar2 = (uchar *)(ev->data).ext.ptr;
      iVar5 = (ev->data).result.event;
      local_48 = puVar2;
      builtin_memcpy(puVar7 + -8,"-o\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      pm_read_bytes((PmInternal *)PVar4,puVar2,iVar5,timestamp_00);
    }
  }
  return;
}

Assistant:

static void handle_event(snd_seq_event_t *ev)
{
    int device_id = ev->dest.port;
    PmInternal *midi = descriptors[device_id].internalDescriptor;
    // There is a race condition when closing a device and
    // continuing to poll other open devices. The closed device may
    // have outstanding events from before the close operation.
    if (!midi) {
        return;
    }
    PmEvent pm_ev;
    PmTimeProcPtr time_proc = midi->time_proc;
    PmTimestamp timestamp;

    /* time stamp should be in ticks, using our queue where 1 tick = 1ms */
    assert((ev->flags & SND_SEQ_TIME_STAMP_MASK) == SND_SEQ_TIME_STAMP_TICK);

    /* if no time_proc, just return "native" ticks (ms) */
    if (time_proc == NULL) {
        timestamp = ev->time.tick;
    } else { /* translate time to time_proc basis */
        snd_seq_queue_status_t *queue_status;
        snd_seq_queue_status_alloca(&queue_status);
        snd_seq_get_queue_status(seq, queue, queue_status);
        /* return (now - alsa_now) + alsa_timestamp */
        timestamp = (*time_proc)(midi->time_info) + ev->time.tick -
                    snd_seq_queue_status_get_tick_time(queue_status);
    }
    pm_ev.timestamp = timestamp;
    switch (ev->type) {
    case SND_SEQ_EVENT_NOTEON:
        pm_ev.message = Pm_Message(0x90 | ev->data.note.channel,
                                   ev->data.note.note & 0x7f,
                                   ev->data.note.velocity & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_NOTEOFF:
        pm_ev.message = Pm_Message(0x80 | ev->data.note.channel,
                                   ev->data.note.note & 0x7f,
                                   ev->data.note.velocity & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_KEYPRESS:
        pm_ev.message = Pm_Message(0xa0 | ev->data.note.channel,
                                   ev->data.note.note & 0x7f,
                                   ev->data.note.velocity & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CONTROLLER:
        pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                   ev->data.control.param & 0x7f,
                                   ev->data.control.value & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_PGMCHANGE:
        pm_ev.message = Pm_Message(0xc0 | ev->data.note.channel,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CHANPRESS:
        pm_ev.message = Pm_Message(0xd0 | ev->data.note.channel,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_PITCHBEND:
        pm_ev.message = Pm_Message(0xe0 | ev->data.note.channel,
                            (ev->data.control.value + 0x2000) & 0x7f,
                            ((ev->data.control.value + 0x2000) >> 7) & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CONTROL14:
        if (ev->data.control.param < 0x20) {
            pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                       ev->data.control.param,
                                       (ev->data.control.value >> 7) & 0x7f);
            pm_read_short(midi, &pm_ev);
            pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                       ev->data.control.param + 0x20,
                                       ev->data.control.value & 0x7f);
            pm_read_short(midi, &pm_ev);
        } else {
            pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                       ev->data.control.param & 0x7f,
                                       ev->data.control.value & 0x7f);

            pm_read_short(midi, &pm_ev);
        }
        break;
    case SND_SEQ_EVENT_SONGPOS:
        pm_ev.message = Pm_Message(0xf2,
                                   ev->data.control.value & 0x7f,
                                   (ev->data.control.value >> 7) & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_SONGSEL:
        pm_ev.message = Pm_Message(0xf3,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_QFRAME:
        pm_ev.message = Pm_Message(0xf1,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_START:
        pm_ev.message = Pm_Message(0xfa, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CONTINUE:
        pm_ev.message = Pm_Message(0xfb, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_STOP:
        pm_ev.message = Pm_Message(0xfc, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CLOCK:
        pm_ev.message = Pm_Message(0xf8, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_TUNE_REQUEST:
        pm_ev.message = Pm_Message(0xf6, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_RESET:
        pm_ev.message = Pm_Message(0xff, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_SENSING:
        pm_ev.message = Pm_Message(0xfe, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_SYSEX: {
        const BYTE *ptr = (const BYTE *) ev->data.ext.ptr;
        /* assume there is one sysex byte to process */
        pm_read_bytes(midi, ptr, ev->data.ext.len, timestamp);
        break;
    }
    }
}